

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O0

void gimage::paste<float>
               (Image<float,_gimage::PixelTraits<float>_> *image,
               Image<float,_gimage::PixelTraits<float>_> *image2,long i0,long k0,int d0,
               float opacity)

{
  float fVar1;
  Image<float,_gimage::PixelTraits<float>_> *this;
  int iVar2;
  int iVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  long in_RCX;
  long in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  float fVar7;
  store_t_conflict sVar8;
  store_t_conflict sVar9;
  long i_1;
  long k_1;
  int d_1;
  float v;
  long i;
  long k;
  int d;
  long local_58;
  long local_50;
  int local_48;
  long local_40;
  long local_38;
  int local_30;
  float local_2c;
  float local_28;
  int local_24;
  long local_20;
  long local_18;
  Image<float,_gimage::PixelTraits<float>_> *local_10;
  Image<float,_gimage::PixelTraits<float>_> *local_8;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (1.0 <= in_XMM0_Da) {
    for (local_48 = 0; iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10),
        local_48 < iVar2; local_48 = local_48 + 1) {
      if ((-1 < local_24 + local_48) &&
         (iVar2 = local_24 + local_48,
         iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8), iVar2 < iVar3)) {
        for (local_50 = 0; lVar5 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10),
            local_50 < lVar5; local_50 = local_50 + 1) {
          if ((-1 < local_20 + local_50) &&
             (lVar5 = local_20 + local_50,
             lVar6 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8), lVar5 < lVar6))
          {
            for (local_58 = 0; lVar5 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10)
                , local_58 < lVar5; local_58 = local_58 + 1) {
              if ((-1 < local_18 + local_58) &&
                 (lVar5 = local_18 + local_58,
                 lVar6 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8),
                 this = local_8, lVar5 < lVar6)) {
                lVar5 = local_18 + local_58;
                lVar6 = local_20 + local_50;
                iVar2 = local_24 + local_48;
                sVar8 = Image<float,_gimage::PixelTraits<float>_>::get
                                  (local_10,local_58,local_50,local_48);
                Image<float,_gimage::PixelTraits<float>_>::set(this,lVar5,lVar6,iVar2,sVar8);
              }
            }
          }
        }
      }
    }
  }
  else {
    local_2c = 0.0;
    pfVar4 = std::max<float>(&local_2c,&local_28);
    local_28 = *pfVar4;
    for (local_30 = 0; iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10),
        local_30 < iVar2; local_30 = local_30 + 1) {
      if ((-1 < local_24 + local_30) &&
         (iVar2 = local_24 + local_30,
         iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8), iVar2 < iVar3)) {
        for (local_38 = 0; lVar5 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10),
            local_38 < lVar5; local_38 = local_38 + 1) {
          if ((-1 < local_20 + local_38) &&
             (lVar5 = local_20 + local_38,
             lVar6 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8), lVar5 < lVar6))
          {
            for (local_40 = 0; lVar5 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10)
                , local_40 < lVar5; local_40 = local_40 + 1) {
              if ((-1 < local_18 + local_40) &&
                 (lVar5 = local_18 + local_40,
                 lVar6 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8), lVar5 < lVar6
                 )) {
                fVar7 = 1.0 - local_28;
                sVar8 = Image<float,_gimage::PixelTraits<float>_>::get
                                  (local_8,local_18 + local_40,local_20 + local_38,
                                   local_24 + local_30);
                fVar1 = local_28;
                sVar9 = Image<float,_gimage::PixelTraits<float>_>::get
                                  (local_10,local_40,local_38,local_30);
                Image<float,_gimage::PixelTraits<float>_>::set
                          (local_8,local_18 + local_40,local_20 + local_38,local_24 + local_30,
                           fVar1 * sVar9 + fVar7 * sVar8);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void paste(Image<T> &image, const Image<T> &image2, long i0=0, long k0=0,
                             int d0=0, float opacity=1.0f)
{
  if (opacity < 1)
  {
    opacity=std::max(0.0f, opacity);

    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                float v=(1-opacity)*image.get(i0+i, k0+k, d0+d);
                v+=opacity*image2.get(i, k, d);
                image.set(i0+i, k0+k, d0+d, static_cast<typename Image<T>::store_t>(v));
              }
  }
  else
  {
    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                image.set(i0+i, k0+k, d0+d, image2.get(i, k, d));
              }
  }
}